

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

void ZSTD_buildFSETable(ZSTD_seqSymbol *dt,short *normalizedCounter,uint maxSymbolValue,
                       U32 *baseValue,U8 *nbAdditionalBits,uint tableLog,void *wksp,size_t wkspSize,
                       int bmi2)

{
  ZSTD_seqSymbol *in_RCX;
  short *in_R8;
  uint in_R9D;
  undefined8 in_stack_00000008;
  U8 *in_stack_00000010;
  int in_stack_00000018;
  void *in_stack_000000f0;
  size_t in_stack_000000f8;
  uint tableLog_00;
  U32 *in_stack_ffffffffffffffc8;
  
  tableLog_00 = (uint)((ulong)in_stack_00000008 >> 0x20);
  if (in_stack_00000018 == 0) {
    ZSTD_buildFSETable_body_default
              (in_RCX,in_R8,in_R9D,in_stack_ffffffffffffffc8,in_stack_00000010,tableLog_00,
               in_stack_000000f0,in_stack_000000f8);
  }
  else {
    ZSTD_buildFSETable_body_bmi2
              (in_RCX,in_R8,in_R9D,in_stack_ffffffffffffffc8,in_stack_00000010,tableLog_00,
               in_stack_000000f0,in_stack_000000f8);
  }
  return;
}

Assistant:

void ZSTD_buildFSETable(ZSTD_seqSymbol* dt,
            const short* normalizedCounter, unsigned maxSymbolValue,
            const U32* baseValue, const U8* nbAdditionalBits,
            unsigned tableLog, void* wksp, size_t wkspSize, int bmi2)
{
#if DYNAMIC_BMI2
    if (bmi2) {
        ZSTD_buildFSETable_body_bmi2(dt, normalizedCounter, maxSymbolValue,
                baseValue, nbAdditionalBits, tableLog, wksp, wkspSize);
        return;
    }
#endif
    (void)bmi2;
    ZSTD_buildFSETable_body_default(dt, normalizedCounter, maxSymbolValue,
            baseValue, nbAdditionalBits, tableLog, wksp, wkspSize);
}